

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_server.c
# Opt level: O0

mk_sched_conn * mk_server_listen_handler(mk_sched_worker *sched,void *data,mk_server *server)

{
  int remote_fd;
  int iVar1;
  mk_sched_conn *data_00;
  int *piVar2;
  char *pcVar3;
  mk_server_listen *listener;
  mk_sched_conn *conn;
  int client_fd;
  int ret;
  mk_server *server_local;
  void *data_local;
  mk_sched_worker *sched_local;
  
  remote_fd = mk_socket_accept(*(int *)((long)data + 0x48));
  if ((remote_fd != -1) &&
     (data_00 = mk_sched_add_connection(remote_fd,(mk_server_listen *)data,sched,server),
     data_00 != (mk_sched_conn *)0x0)) {
    iVar1 = mk_event_add(sched->loop,remote_fd,3,1,data_00);
    if (iVar1 == 0) {
      sched->accepted_connections = sched->accepted_connections + 1;
      return data_00;
    }
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    mk_print(0x1001,"[server] Error registering file descriptor: %s",pcVar3);
  }
  if (remote_fd != -1) {
    (**(code **)(*(long *)(*(long *)((long)data + 0x50) + 0x50) + 0x18))
              (*(undefined8 *)((long)data + 0x50),remote_fd);
  }
  return (mk_sched_conn *)0x0;
}

Assistant:

static inline
struct mk_sched_conn *mk_server_listen_handler(struct mk_sched_worker *sched,
                                               void *data,
                                               struct mk_server *server)
{
    int ret;
    int client_fd = -1;
    struct mk_sched_conn *conn;
    struct mk_server_listen *listener = data;

    client_fd = mk_socket_accept(listener->server_fd);
    if (mk_unlikely(client_fd == -1)) {
        MK_TRACE("[server] Accept connection failed: %s", strerror(errno));
        goto error;
    }

    conn = mk_sched_add_connection(client_fd, listener, sched, server);
    if (mk_unlikely(!conn)) {
        goto error;
    }

    ret = mk_event_add(sched->loop, client_fd,
                       MK_EVENT_CONNECTION, MK_EVENT_READ, conn);
    if (mk_unlikely(ret != 0)) {
        mk_err("[server] Error registering file descriptor: %s",
               strerror(errno));
        goto error;
    }

    sched->accepted_connections++;
    MK_TRACE("[server] New connection arrived: FD %i", client_fd);
    return conn;

error:
    if (client_fd != -1) {
        listener->network->network->close(listener->network, client_fd);
    }

    return NULL;
}